

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void __thiscall
duckdb::BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t>::CalculateDeltaStats
          (BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t> *this)

{
  uint64_t *puVar1;
  hugeint_t *phVar2;
  int64_t iVar3;
  hugeint_t b;
  hugeint_t b_00;
  hugeint_t a;
  hugeint_t a_00;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  int64_t i;
  long lVar7;
  ulong uVar8;
  hugeint_t hVar9;
  hugeint_t right;
  hugeint_t bogus;
  uint64_t in_stack_ffffffffffffffc8;
  uint64_t in_stack_ffffffffffffffd0;
  
  bogus.lower = 0xffffffffffffffff;
  bogus.upper = 0x7fffffffffffffff;
  bVar4 = hugeint_t::operator>(&this->maximum,&bogus);
  if (bVar4) {
    return;
  }
  if (this->compression_buffer_idx < 2) {
    return;
  }
  if (this->all_valid != true) {
    return;
  }
  bVar4 = TrySubtractOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                    (this->minimum,this->maximum,&bogus);
  if ((bVar4) &&
     (bVar4 = TrySubtractOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                        (this->maximum,this->minimum,&bogus), bVar4)) {
    lVar6 = 0;
    for (lVar7 = 0; uVar5 = this->compression_buffer_idx, lVar7 < (long)uVar5; lVar7 = lVar7 + 1) {
      puVar1 = (uint64_t *)((long)&this->compression_buffer->lower + lVar6);
      bogus.lower = *puVar1;
      bogus.upper = puVar1[1];
      puVar1 = (uint64_t *)((long)&this->compression_buffer[-1].lower + lVar6);
      in_stack_ffffffffffffffc8 = *puVar1;
      in_stack_ffffffffffffffd0 = puVar1[1];
      hVar9 = hugeint_t::operator-(&bogus,(hugeint_t *)&stack0xffffffffffffffc8);
      *(uint64_t *)((long)&this->delta_buffer[0].lower + lVar6) = hVar9.lower;
      *(int64_t *)((long)&this->delta_buffer[0].upper + lVar6) = hVar9.upper;
      lVar6 = lVar6 + 0x10;
    }
  }
  else {
    lVar6 = -1;
    lVar7 = 0;
    while( true ) {
      uVar5 = this->compression_buffer_idx;
      lVar6 = lVar6 + 1;
      if ((long)uVar5 <= lVar6) break;
      phVar2 = this->compression_buffer;
      hVar9.upper = *(int64_t *)((long)&phVar2->upper + lVar7);
      hVar9.lower = *(uint64_t *)((long)&phVar2->lower + lVar7);
      right.upper = *(int64_t *)((long)phVar2 + lVar7 + -8);
      right.lower = *(uint64_t *)((long)&phVar2[-1].lower + lVar7);
      bVar4 = TrySubtractOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                        (hVar9,right,(hugeint_t *)((long)&this->delta_buffer[0].lower + lVar7));
      lVar7 = lVar7 + 0x10;
      if (!bVar4) {
        return;
      }
    }
  }
  this->can_do_delta = true;
  for (uVar8 = 1; uVar8 < uVar5; uVar8 = uVar8 + 1) {
    a.upper = in_stack_ffffffffffffffd0;
    a.lower = in_stack_ffffffffffffffc8;
    b.upper = bogus.upper;
    b.lower = bogus.lower;
    hVar9 = MaxValue<duckdb::hugeint_t>(a,b);
    this->maximum_delta = hVar9;
    a_00.upper = in_stack_ffffffffffffffd0;
    a_00.lower = in_stack_ffffffffffffffc8;
    b_00.upper = bogus.upper;
    b_00.lower = bogus.lower;
    hVar9 = MinValue<duckdb::hugeint_t>(a_00,b_00);
    this->minimum_delta = hVar9;
    uVar5 = this->compression_buffer_idx;
  }
  iVar3 = (this->minimum_delta).upper;
  this->delta_buffer[0].lower = (this->minimum_delta).lower;
  this->delta_buffer[0].upper = iVar3;
  if (this->can_do_delta != false) {
    bVar4 = TrySubtractOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                      (this->maximum_delta,this->minimum_delta,&this->min_max_delta_diff);
    this->can_do_delta = bVar4;
    if (bVar4) {
      bVar4 = TrySubtractOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                        (*this->compression_buffer,this->minimum_delta,&this->delta_offset);
      goto LAB_014f4256;
    }
  }
  bVar4 = false;
LAB_014f4256:
  this->can_do_delta = bVar4;
  return;
}

Assistant:

void CalculateDeltaStats() {
		// TODO: currently we dont support delta compression of values above NumericLimits<T_S>::Maximum(),
		// 		 we could support this with some clever substract trickery?
		if (maximum > static_cast<T>(NumericLimits<T_S>::Maximum())) {
			return;
		}

		// Don't delta encoding 1 value makes no sense
		if (compression_buffer_idx < 2) {
			return;
		}

		// TODO: handle NULLS here?
		// Currently we cannot handle nulls because we would need an additional step of patching for this.
		// we could for example copy the last value on a null insert. This would help a bit, but not be optimal for
		// large deltas since theres suddenly a zero then. Ideally we would insert a value that leads to a delta within
		// the current domain of deltas however we dont know that domain here yet
		if (!all_valid) {
			return;
		}

		// Note: since we dont allow any values over NumericLimits<T_S>::Maximum(), all subtractions for unsigned types
		// are guaranteed not to overflow
		bool can_do_all = true;
		if (NumericLimits<T>::IsSigned()) {
			T_S bogus;
			can_do_all = TrySubtractOperator::Operation(static_cast<T_S>(minimum), static_cast<T_S>(maximum), bogus) &&
			             TrySubtractOperator::Operation(static_cast<T_S>(maximum), static_cast<T_S>(minimum), bogus);
		}

		// Calculate delta's
		// compression_buffer pointer points one element ahead of the internal buffer making the use of signed index
		// integer (-1) possible
		D_ASSERT(compression_buffer_idx <= NumericLimits<int64_t>::Maximum());
		if (can_do_all) {
			for (int64_t i = 0; i < static_cast<int64_t>(compression_buffer_idx); i++) {
				delta_buffer[i] = static_cast<T_S>(compression_buffer[i]) - static_cast<T_S>(compression_buffer[i - 1]);
			}
		} else {
			for (int64_t i = 0; i < static_cast<int64_t>(compression_buffer_idx); i++) {
				auto success =
				    TrySubtractOperator::Operation(static_cast<T_S>(compression_buffer[i]),
				                                   static_cast<T_S>(compression_buffer[i - 1]), delta_buffer[i]);
				if (!success) {
					return;
				}
			}
		}

		can_do_delta = true;

		for (idx_t i = 1; i < compression_buffer_idx; i++) {
			maximum_delta = MaxValue<T_S>(maximum_delta, delta_buffer[i]);
			minimum_delta = MinValue<T_S>(minimum_delta, delta_buffer[i]);
		}

		// Since we can set the first value arbitrarily, we want to pick one from the current domain, note that
		// we will store the original first value - this offset as the  delta_offset to be able to decode this again.
		delta_buffer[0] = minimum_delta;

		can_do_delta = can_do_delta && TrySubtractOperator::Operation(maximum_delta, minimum_delta, min_max_delta_diff);
		can_do_delta = can_do_delta && TrySubtractOperator::Operation(static_cast<T_S>(compression_buffer[0]),
		                                                              minimum_delta, delta_offset);
	}